

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

double QualityToJPEGCompression(double c,double alpha)

{
  double in_XMM0_Qa;
  double dVar1;
  double in_XMM1_Qa;
  double v;
  double expn;
  double slope;
  double exp_max;
  double exp_min;
  double amax;
  double amin;
  undefined8 local_58;
  undefined8 local_50;
  
  if (in_XMM1_Qa <= 0.85) {
    if (0.3 <= in_XMM1_Qa) {
      local_58 = (in_XMM1_Qa - 0.3) * -0.9090909090909091 + 0.9;
    }
    else {
      local_58 = 0.9;
    }
    local_50 = local_58;
  }
  else {
    local_50 = 0.4;
  }
  dVar1 = pow(in_XMM0_Qa,local_50);
  return dVar1;
}

Assistant:

static double QualityToJPEGCompression(double c, double alpha) {
  // We map the complexity 'alpha' and quality setting 'c' to a compression
  // exponent empirically matched to the compression curve of libjpeg6b.
  // On average, the WebP output size will be roughly similar to that of a
  // JPEG file compressed with same quality factor.
  const double amin = 0.30;
  const double amax = 0.85;
  const double exp_min = 0.4;
  const double exp_max = 0.9;
  const double slope = (exp_min - exp_max) / (amax - amin);
  // Linearly interpolate 'expn' from exp_min to exp_max
  // in the [amin, amax] range.
  const double expn = (alpha > amax) ? exp_min
                    : (alpha < amin) ? exp_max
                    : exp_max + slope * (alpha - amin);
  const double v = pow(c, expn);
  return v;
}